

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
               (void)

{
  pointer *ppuVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  lazy_ostream *plVar6;
  undefined4 local_10b0;
  Index local_10ac;
  basic_cstring<const_char> local_10a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1098;
  basic_cstring<const_char> local_1070;
  basic_cstring<const_char> local_1060;
  undefined4 local_1050;
  Index local_104c;
  basic_cstring<const_char> local_1048;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1038;
  basic_cstring<const_char> local_1010;
  basic_cstring<const_char> local_1000;
  undefined4 local_ff0;
  Index local_fec;
  basic_cstring<const_char> local_fe8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_fd8;
  basic_cstring<const_char> local_fb0;
  basic_cstring<const_char> local_fa0;
  undefined4 local_f90;
  ID_index local_f8c;
  basic_cstring<const_char> local_f88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f78;
  basic_cstring<const_char> local_f50;
  basic_cstring<const_char> local_f40;
  uint local_f30;
  ID_index local_f2c;
  basic_cstring<const_char> local_f28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f18;
  basic_cstring<const_char> local_ef0;
  basic_cstring<const_char> local_ee0;
  undefined4 local_ed0;
  ID_index local_ecc;
  basic_cstring<const_char> local_ec8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_eb8;
  basic_cstring<const_char> local_e90;
  basic_cstring<const_char> local_e80;
  undefined4 local_e70;
  ID_index local_e6c;
  basic_cstring<const_char> local_e68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e58;
  basic_cstring<const_char> local_e30;
  basic_cstring<const_char> local_e20;
  uint local_e10;
  ID_index local_e0c;
  basic_cstring<const_char> local_e08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_df8;
  basic_cstring<const_char> local_dd0;
  basic_cstring<const_char> local_dc0;
  uint local_db0;
  ID_index local_dac;
  basic_cstring<const_char> local_da8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d98;
  basic_cstring<const_char> local_d70;
  basic_cstring<const_char> local_d60;
  uint local_d50;
  ID_index local_d4c;
  basic_cstring<const_char> local_d48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d38;
  basic_cstring<const_char> local_d10;
  basic_cstring<const_char> local_d00;
  undefined4 local_cf0;
  Dimension local_cec;
  basic_cstring<const_char> local_ce8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_cd8;
  basic_cstring<const_char> local_cb0;
  basic_cstring<const_char> local_ca0;
  undefined4 local_c90;
  Dimension local_c8c;
  basic_cstring<const_char> local_c88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c78;
  basic_cstring<const_char> local_c50;
  basic_cstring<const_char> local_c40;
  undefined4 local_c30;
  Dimension local_c2c;
  basic_cstring<const_char> local_c28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c18;
  basic_cstring<const_char> local_bf0;
  basic_cstring<const_char> local_be0;
  undefined4 local_bd0;
  Dimension local_bcc;
  basic_cstring<const_char> local_bc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_bb8;
  basic_cstring<const_char> local_b90;
  basic_cstring<const_char> local_b80;
  undefined4 local_b70;
  Dimension local_b6c;
  basic_cstring<const_char> local_b68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b58;
  basic_cstring<const_char> local_b30;
  basic_cstring<const_char> local_b20;
  undefined4 local_b10;
  Dimension local_b0c;
  basic_cstring<const_char> local_b08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_af8;
  basic_cstring<const_char> local_ad0;
  basic_cstring<const_char> local_ac0;
  undefined4 local_ab0;
  Dimension local_aac;
  basic_cstring<const_char> local_aa8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a98;
  basic_cstring<const_char> local_a70;
  basic_cstring<const_char> local_a60;
  basic_cstring<const_char> local_a50;
  basic_cstring<const_char> local_a40;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a30;
  assertion_result local_a10;
  basic_cstring<const_char> local_9f8;
  basic_cstring<const_char> local_9e8;
  basic_cstring<const_char> local_9d8;
  basic_cstring<const_char> local_9c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9b8;
  assertion_result local_998;
  basic_cstring<const_char> local_980;
  basic_cstring<const_char> local_970;
  basic_cstring<const_char> local_960;
  basic_cstring<const_char> local_950;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_940;
  assertion_result local_920;
  basic_cstring<const_char> local_908;
  basic_cstring<const_char> local_8f8;
  basic_cstring<const_char> local_8e8;
  basic_cstring<const_char> local_8d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8c8;
  assertion_result local_8a8;
  basic_cstring<const_char> local_890;
  basic_cstring<const_char> local_880;
  basic_cstring<const_char> local_870;
  basic_cstring<const_char> local_860;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_850;
  assertion_result local_830;
  basic_cstring<const_char> local_818;
  basic_cstring<const_char> local_808;
  basic_cstring<const_char> local_7f8;
  basic_cstring<const_char> local_7e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7d8;
  assertion_result local_7b8;
  basic_cstring<const_char> local_7a0;
  basic_cstring<const_char> local_790;
  basic_cstring<const_char> local_780;
  basic_cstring<const_char> local_770;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_760;
  assertion_result local_740;
  basic_cstring<const_char> local_728;
  basic_cstring<const_char> local_718;
  basic_cstring<const_char> local_708;
  basic_cstring<const_char> local_6f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6e8;
  assertion_result local_6c8;
  basic_cstring<const_char> local_6b0;
  basic_cstring<const_char> local_6a0;
  basic_cstring<const_char> local_690;
  basic_cstring<const_char> local_680;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_670;
  assertion_result local_650;
  basic_cstring<const_char> local_638;
  basic_cstring<const_char> local_628;
  undefined4 local_618;
  Index local_614;
  basic_cstring<const_char> local_610;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_600;
  basic_cstring<const_char> local_5d8;
  basic_cstring<const_char> local_5c8;
  undefined4 local_5b8;
  Index local_5b4;
  basic_cstring<const_char> local_5b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5a0;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  undefined4 local_558;
  Index local_554;
  basic_cstring<const_char> local_550;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_540;
  basic_cstring<const_char> local_518;
  basic_cstring<const_char> local_508;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d8;
  assertion_result local_4b8;
  basic_cstring<const_char> local_4a0;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_460;
  assertion_result local_440;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3e8;
  assertion_result local_3c8;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  basic_cstring<const_char> local_380;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_370;
  assertion_result local_350;
  basic_cstring<const_char> local_338;
  basic_cstring<const_char> local_328;
  basic_cstring<const_char> local_318;
  basic_cstring<const_char> local_308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2f8;
  assertion_result local_2d8;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  basic_cstring<const_char> local_290;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_280;
  assertion_result local_260;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_208;
  assertion_result local_1e8;
  basic_cstring<const_char> local_1d0;
  basic_cstring<const_char> local_1c0;
  undefined1 local_1b0 [8];
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  m;
  value_type boundary1;
  undefined1 local_38 [8];
  value_type boundary2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
            ();
  pvVar5 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,pvVar5);
  ppuVar1 = &boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)ppuVar1);
  pvVar5 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)ppuVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&m.matrix_.operators_,pvVar5);
  ppuVar1 = &boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)ppuVar1);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>
              *)local_1b0,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)ppuVar1,5);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1c0,0x1ba,&local_1d0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,1,0);
    boost::test_tools::assertion_result::assertion_result(&local_1e8,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,"m.is_zero_entry(1, 0)",0x15);
    boost::unit_test::operator<<(&local_208,plVar6,&local_218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1e8,&local_208,&local_228,0x1ba,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_208);
    boost::test_tools::assertion_result::~assertion_result(&local_1e8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_248);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_238,0x1bb,&local_248);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,3,0);
    boost::test_tools::assertion_result::assertion_result(&local_260,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,"!m.is_zero_entry(3, 0)",0x16);
    boost::unit_test::operator<<(&local_280,plVar6,&local_290);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_260,&local_280,&local_2a0,0x1bb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_280);
    boost::test_tools::assertion_result::~assertion_result(&local_260);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_2b0,0x1bc,&local_2c0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,0);
    boost::test_tools::assertion_result::assertion_result(&local_2d8,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,"m.is_zero_column(0)",0x13);
    boost::unit_test::operator<<(&local_2f8,plVar6,&local_308);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2d8,&local_2f8,&local_318,0x1bc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2f8);
    boost::test_tools::assertion_result::~assertion_result(&local_2d8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_338);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_328,0x1bd,&local_338);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,1);
    boost::test_tools::assertion_result::assertion_result(&local_350,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,"m.is_zero_column(1)",0x13);
    boost::unit_test::operator<<(&local_370,plVar6,&local_380);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_350,&local_370,&local_390,0x1bd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_370);
    boost::test_tools::assertion_result::~assertion_result(&local_350);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_3a0,0x1be,&local_3b0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,2);
    boost::test_tools::assertion_result::assertion_result(&local_3c8,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,"m.is_zero_column(2)",0x13);
    boost::unit_test::operator<<(&local_3e8,plVar6,&local_3f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3c8,&local_3e8,&local_408,0x1be,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3e8);
    boost::test_tools::assertion_result::~assertion_result(&local_3c8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_428);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_418,0x1bf,&local_428);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,3);
    boost::test_tools::assertion_result::assertion_result(&local_440,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_460,plVar6,&local_470);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_440,&local_460,&local_480,0x1bf,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_460);
    boost::test_tools::assertion_result::~assertion_result(&local_440);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_490,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_490,0x1c0,&local_4a0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,4);
    boost::test_tools::assertion_result::assertion_result(&local_4b8,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,"!m.is_zero_column(4)",0x14);
    boost::unit_test::operator<<(&local_4d8,plVar6,&local_4e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4b8,&local_4d8,&local_4f8,0x1c0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4d8);
    boost::test_tools::assertion_result::~assertion_result(&local_4b8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_518);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_508,0x1c2,&local_518);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_540,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_550,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_554 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0);
    local_558 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_540,&local_550,0x1c2,1,2,&local_554,"m.get_number_of_columns()",&local_558,"5"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_540);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>::
  insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>
              *)local_1b0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&m.matrix_.operators_,iVar4);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_568,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_578);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_568,0x1c4,&local_578);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5a0,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_5b4 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0);
    local_5b8 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_5a0,&local_5b0,0x1c4,1,2,&local_5b4,"m.get_number_of_columns()",&local_5b8,"6"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5a0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>::
  insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>
              *)local_1b0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,iVar4);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_5c8,0x1c6,&local_5d8);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_600,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_614 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0);
    local_618 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_600,&local_610,0x1c6,1,2,&local_614,"m.get_number_of_columns()",&local_618,"7"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_600);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_638);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_628,0x1c7,&local_638);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,1,0);
    boost::test_tools::assertion_result::assertion_result(&local_650,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_680,"m.is_zero_entry(1, 0)",0x15);
    boost::unit_test::operator<<(&local_670,plVar6,&local_680);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_650,&local_670,&local_690,0x1c7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_670);
    boost::test_tools::assertion_result::~assertion_result(&local_650);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_6a0,0x1c8,&local_6b0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,3,0);
    boost::test_tools::assertion_result::assertion_result(&local_6c8,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f8,"!m.is_zero_entry(3, 0)",0x16);
    boost::unit_test::operator<<(&local_6e8,plVar6,&local_6f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_708,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_6c8,&local_6e8,&local_708,0x1c8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6e8);
    boost::test_tools::assertion_result::~assertion_result(&local_6c8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_718,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_728);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_718,0x1c9,&local_728);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,0);
    boost::test_tools::assertion_result::assertion_result(&local_740,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_770,"m.is_zero_column(0)",0x13);
    boost::unit_test::operator<<(&local_760,plVar6,&local_770);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_780,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_740,&local_760,&local_780,0x1c9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_760);
    boost::test_tools::assertion_result::~assertion_result(&local_740);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_790,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_790,0x1ca,&local_7a0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,1);
    boost::test_tools::assertion_result::assertion_result(&local_7b8,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e8,"m.is_zero_column(1)",0x13);
    boost::unit_test::operator<<(&local_7d8,plVar6,&local_7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_7b8,&local_7d8,&local_7f8,0x1ca,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7d8);
    boost::test_tools::assertion_result::~assertion_result(&local_7b8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_808,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_818);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_808,0x1cb,&local_818);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,2);
    boost::test_tools::assertion_result::assertion_result(&local_830,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_860,"m.is_zero_column(2)",0x13);
    boost::unit_test::operator<<(&local_850,plVar6,&local_860);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_870,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_830,&local_850,&local_870,0x1cb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_850);
    boost::test_tools::assertion_result::~assertion_result(&local_830);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_880,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_890);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_880,0x1cc,&local_890);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,3);
    boost::test_tools::assertion_result::assertion_result(&local_8a8,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d8,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_8c8,plVar6,&local_8d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_8a8,&local_8c8,&local_8e8,0x1cc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8c8);
    boost::test_tools::assertion_result::~assertion_result(&local_8a8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_908);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_8f8,0x1cd,&local_908);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,4);
    boost::test_tools::assertion_result::assertion_result(&local_920,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_950,"!m.is_zero_column(4)",0x14);
    boost::unit_test::operator<<(&local_940,plVar6,&local_950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_960,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_920,&local_940,&local_960,0x1cd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_940);
    boost::test_tools::assertion_result::~assertion_result(&local_920);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_970,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_980);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_970,0x1cf,&local_980);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,5);
    boost::test_tools::assertion_result::assertion_result(&local_998,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c8,"m.is_zero_column(5)",0x13);
    boost::unit_test::operator<<(&local_9b8,plVar6,&local_9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_998,&local_9b8,&local_9d8,0x1cf,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9b8);
    boost::test_tools::assertion_result::~assertion_result(&local_998);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_9e8,0x1d3,&local_9f8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                              *)local_1b0,6);
    boost::test_tools::assertion_result::assertion_result(&local_a10,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a40,"!m.is_zero_column(6)",0x14);
    boost::unit_test::operator<<(&local_a30,plVar6,&local_a40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a50,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a10,&local_a30,&local_a50,0x1d3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a30);
    boost::test_tools::assertion_result::~assertion_result(&local_a10);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_a60,0x1d5,&local_a70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a98,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_aa8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_aac = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,0);
    local_ab0 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a98,&local_aa8,0x1d5,1,2,&local_aac,"m.get_column_dimension(0)",&local_ab0,"0"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a98);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ac0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ad0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_ac0,0x1d6,&local_ad0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_af8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_b0c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,1);
    local_b10 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_af8,&local_b08,0x1d6,1,2,&local_b0c,"m.get_column_dimension(1)",&local_b10,"0"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_af8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_b20,0x1d7,&local_b30);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b58,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_b6c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,2);
    local_b70 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b58,&local_b68,0x1d7,1,2,&local_b6c,"m.get_column_dimension(2)",&local_b70,"0"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b58);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_b80,0x1d8,&local_b90);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_bb8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_bcc = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,3);
    local_bd0 = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_bb8,&local_bc8,0x1d8,1,2,&local_bcc,"m.get_column_dimension(3)",&local_bd0,"1"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_bb8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_be0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bf0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_be0,0x1d9,&local_bf0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c18,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_c2c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,4);
    local_c30 = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c18,&local_c28,0x1d9,1,2,&local_c2c,"m.get_column_dimension(4)",&local_c30,"1"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c18);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_c40,0x1da,&local_c50);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c78,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_c8c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,5);
    local_c90 = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c78,&local_c88,0x1da,1,2,&local_c8c,"m.get_column_dimension(5)",&local_c90,"1"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c78);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_ca0,0x1db,&local_cb0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_cd8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ce8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_cec = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,6);
    local_cf0 = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_cd8,&local_ce8,0x1db,1,2,&local_cec,"m.get_column_dimension(6)",&local_cf0,"2"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_cd8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_d00,0x1dd,&local_d10);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d38,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_d4c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,0);
    local_d50 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_d38,&local_d48,0x1dd,1,2,&local_d4c,"m.get_pivot(0)",&local_d50,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d38);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_d60,0x1de,&local_d70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d98,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_da8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_dac = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,1);
    local_db0 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_d98,&local_da8,0x1de,1,2,&local_dac,"m.get_pivot(1)",&local_db0,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d98);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_dd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_dc0,0x1df,&local_dd0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_df8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_e0c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,2);
    local_e10 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_df8,&local_e08,0x1df,1,2,&local_e0c,"m.get_pivot(2)",&local_e10,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_df8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_e20,0x1e0,&local_e30);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e58,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_e6c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,3);
    local_e70 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_e58,&local_e68,0x1e0,1,2,&local_e6c,"m.get_pivot(3)",&local_e70,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e58);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_e80,0x1e1,&local_e90);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_eb8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ec8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_ecc = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,4);
    local_ed0 = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_eb8,&local_ec8,0x1e1,1,2,&local_ecc,"m.get_pivot(4)",&local_ed0,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_eb8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ee0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ef0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_ee0,0x1e3,&local_ef0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f18,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_f2c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,5);
    local_f30 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_f18,&local_f28,0x1e3,1,2,&local_f2c,"m.get_pivot(5)",&local_f30,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f18);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_f40,0x1e7,&local_f50);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f78,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_f8c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,6);
    local_f90 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_f78,&local_f88,0x1e7,1,2,&local_f8c,"m.get_pivot(6)",&local_f90,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f78);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fa0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_fb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_fa0,0x1ea,&local_fb0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_fd8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fe8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_fec = Gudhi::persistence_matrix::
                Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                ::get_column_with_pivot
                          ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                            *)local_1b0,1);
    local_ff0 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_fd8,&local_fe8,0x1ea,1,2,&local_fec,"m.get_column_with_pivot(1)",&local_ff0,
               "3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_fd8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1000,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1010);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1000,0x1eb,&local_1010);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1038,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1048,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_104c = Gudhi::persistence_matrix::
                 Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                 ::get_column_with_pivot
                           ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,2);
    local_1050 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_1038,&local_1048,0x1eb,1,2,&local_104c,"m.get_column_with_pivot(2)",
               &local_1050,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1038);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1060,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1070);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1060,0x1ec,&local_1070);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1098,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_10ac = Gudhi::persistence_matrix::
                 Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                 ::get_column_with_pivot
                           ((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
                             *)local_1b0,5);
    local_10b0 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_1098,&local_10a8,0x1ec,1,2,&local_10ac,"m.get_column_with_pivot(5)",
               &local_10b0,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1098);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
             *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&m.matrix_.operators_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}